

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFloatStateQueryTests.cpp
# Opt level: O0

int __thiscall
deqp::gles2::Functional::FloatStateQueryTests::init(FloatStateQueryTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  int iVar2;
  GetBooleanVerifier *this_00;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestContext *pTVar4;
  TestLog *pTVar5;
  GetIntegerVerifier *this_01;
  undefined4 extraout_var_00;
  GetFloatVerifier *this_02;
  undefined4 extraout_var_01;
  DepthRangeCase *this_03;
  char *pcVar6;
  StateVerifier *pSVar7;
  LineWidthCase *this_04;
  PolygonOffsetFactorCase *this_05;
  PolygonOffsetUnitsCase *this_06;
  SampleCoverageCase *this_07;
  ColorClearCase *this_08;
  DepthClearCase *this_09;
  AliasedPointSizeRangeCase *this_10;
  AliasedLineWidthRangeCase *this_11;
  allocator<char> local_309;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  StateVerifier *local_2c8;
  StateVerifier *verifier_8;
  int _verifierNdx_8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  StateVerifier *local_278;
  StateVerifier *verifier_7;
  int _verifierNdx_7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  StateVerifier *local_228;
  StateVerifier *verifier_6;
  int _verifierNdx_6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  StateVerifier *local_1d8;
  StateVerifier *verifier_5;
  int _verifierNdx_5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  StateVerifier *local_188;
  StateVerifier *verifier_4;
  int _verifierNdx_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  StateVerifier *local_138;
  StateVerifier *verifier_3;
  int _verifierNdx_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  StateVerifier *local_e8;
  StateVerifier *verifier_2;
  int _verifierNdx_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  StateVerifier *local_98;
  StateVerifier *verifier_1;
  int _verifierNdx_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  StateVerifier *local_48;
  StateVerifier *verifier;
  GetBooleanVerifier *pGStack_38;
  int _verifierNdx;
  StateVerifier *verifiers [3];
  FloatStateQueryTests *this_local;
  
  this_00 = (GetBooleanVerifier *)operator_new(0x28);
  pRVar3 = gles2::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  pTVar4 = gles2::Context::getTestContext((this->super_TestCaseGroup).m_context);
  pTVar5 = tcu::TestContext::getLog(pTVar4);
  FloatStateQueryVerifiers::GetBooleanVerifier::GetBooleanVerifier
            (this_00,(Functions *)CONCAT44(extraout_var,iVar2),pTVar5);
  this->m_verifierBoolean = this_00;
  this_01 = (GetIntegerVerifier *)operator_new(0x28);
  pRVar3 = gles2::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  pTVar4 = gles2::Context::getTestContext((this->super_TestCaseGroup).m_context);
  pTVar5 = tcu::TestContext::getLog(pTVar4);
  FloatStateQueryVerifiers::GetIntegerVerifier::GetIntegerVerifier
            (this_01,(Functions *)CONCAT44(extraout_var_00,iVar2),pTVar5);
  this->m_verifierInteger = this_01;
  this_02 = (GetFloatVerifier *)operator_new(0x28);
  pRVar3 = gles2::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  pTVar4 = gles2::Context::getTestContext((this->super_TestCaseGroup).m_context);
  pTVar5 = tcu::TestContext::getLog(pTVar4);
  FloatStateQueryVerifiers::GetFloatVerifier::GetFloatVerifier
            (this_02,(Functions *)CONCAT44(extraout_var_01,iVar2),pTVar5);
  this->m_verifierFloat = this_02;
  pGStack_38 = this->m_verifierBoolean;
  verifiers[0] = &this->m_verifierInteger->super_StateVerifier;
  pSVar7 = &this->m_verifierFloat->super_StateVerifier;
  verifiers[1] = pSVar7;
  verifier._4_4_ = 0;
  while ((int)verifier._4_4_ < 3) {
    local_48 = *(StateVerifier **)((long)&stack0xffffffffffffffc8 + (long)(int)verifier._4_4_ * 8);
    this_03 = (DepthRangeCase *)operator_new(0xa0);
    pSVar7 = local_48;
    verifier_1._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_1,"depth_range",(allocator<char> *)((long)&verifier_1 + 7));
    pcVar6 = FloatStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_48);
    std::operator+(&local_68,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_1,pcVar6);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::DepthRangeCase::DepthRangeCase(this_03,pCVar1,pSVar7,pcVar6,"DEPTH_RANGE");
    verifier_1._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_03);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&_verifierNdx_1);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_1 + 7));
    verifier._4_4_ = verifier._4_4_ + 1;
    pSVar7 = (StateVerifier *)(ulong)verifier._4_4_;
  }
  verifier_1._0_4_ = 0;
  while ((int)(uint)verifier_1 < 3) {
    local_98 = *(StateVerifier **)((long)&stack0xffffffffffffffc8 + (long)(int)(uint)verifier_1 * 8)
    ;
    this_04 = (LineWidthCase *)operator_new(0xa0);
    pSVar7 = local_98;
    verifier_2._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_2,"line_width",(allocator<char> *)((long)&verifier_2 + 7));
    pcVar6 = FloatStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_98);
    std::operator+(&local_b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_2,pcVar6);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::LineWidthCase::LineWidthCase(this_04,pCVar1,pSVar7,pcVar6,"LINE_WIDTH");
    verifier_2._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_04);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&_verifierNdx_2);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_2 + 7));
    verifier_1._0_4_ = (uint)verifier_1 + 1;
    pSVar7 = (StateVerifier *)(ulong)(uint)verifier_1;
  }
  verifier_2._0_4_ = 0;
  while ((int)(uint)verifier_2 < 3) {
    local_e8 = *(StateVerifier **)((long)&stack0xffffffffffffffc8 + (long)(int)(uint)verifier_2 * 8)
    ;
    this_05 = (PolygonOffsetFactorCase *)operator_new(0xa0);
    pSVar7 = local_e8;
    verifier_3._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_3,"polygon_offset_factor",
               (allocator<char> *)((long)&verifier_3 + 7));
    pcVar6 = FloatStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_e8);
    std::operator+(&local_108,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_3,pcVar6);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::PolygonOffsetFactorCase::PolygonOffsetFactorCase
              (this_05,pCVar1,pSVar7,pcVar6,"POLYGON_OFFSET_FACTOR");
    verifier_3._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_05);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&_verifierNdx_3);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_3 + 7));
    verifier_2._0_4_ = (uint)verifier_2 + 1;
    pSVar7 = (StateVerifier *)(ulong)(uint)verifier_2;
  }
  verifier_3._0_4_ = 0;
  while ((int)(uint)verifier_3 < 3) {
    local_138 = *(StateVerifier **)
                 ((long)&stack0xffffffffffffffc8 + (long)(int)(uint)verifier_3 * 8);
    this_06 = (PolygonOffsetUnitsCase *)operator_new(0xa0);
    pSVar7 = local_138;
    verifier_4._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_4,"polygon_offset_units",
               (allocator<char> *)((long)&verifier_4 + 7));
    pcVar6 = FloatStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_138);
    std::operator+(&local_158,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_4,pcVar6);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::PolygonOffsetUnitsCase::PolygonOffsetUnitsCase
              (this_06,pCVar1,pSVar7,pcVar6,"POLYGON_OFFSET_UNITS");
    verifier_4._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_06);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)&_verifierNdx_4);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_4 + 7));
    verifier_3._0_4_ = (uint)verifier_3 + 1;
    pSVar7 = (StateVerifier *)(ulong)(uint)verifier_3;
  }
  verifier_4._0_4_ = 0;
  while ((int)(uint)verifier_4 < 3) {
    local_188 = *(StateVerifier **)
                 ((long)&stack0xffffffffffffffc8 + (long)(int)(uint)verifier_4 * 8);
    this_07 = (SampleCoverageCase *)operator_new(0xa0);
    pSVar7 = local_188;
    verifier_5._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_5,"sample_coverage_value",
               (allocator<char> *)((long)&verifier_5 + 7));
    pcVar6 = FloatStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_188);
    std::operator+(&local_1a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_5,pcVar6);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::SampleCoverageCase::SampleCoverageCase
              (this_07,pCVar1,pSVar7,pcVar6,"SAMPLE_COVERAGE_VALUE");
    verifier_5._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_07);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::~string((string *)&_verifierNdx_5);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_5 + 7));
    verifier_4._0_4_ = (uint)verifier_4 + 1;
    pSVar7 = (StateVerifier *)(ulong)(uint)verifier_4;
  }
  verifier_5._0_4_ = 0;
  while ((int)(uint)verifier_5 < 3) {
    local_1d8 = *(StateVerifier **)
                 ((long)&stack0xffffffffffffffc8 + (long)(int)(uint)verifier_5 * 8);
    this_08 = (ColorClearCase *)operator_new(0xa0);
    pSVar7 = local_1d8;
    verifier_6._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_6,"color_clear_value",
               (allocator<char> *)((long)&verifier_6 + 7));
    pcVar6 = FloatStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_1d8);
    std::operator+(&local_1f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_6,pcVar6);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::ColorClearCase::ColorClearCase(this_08,pCVar1,pSVar7,pcVar6,"COLOR_CLEAR_VALUE")
    ;
    verifier_6._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_08);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&_verifierNdx_6);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_6 + 7));
    verifier_5._0_4_ = (uint)verifier_5 + 1;
    pSVar7 = (StateVerifier *)(ulong)(uint)verifier_5;
  }
  verifier_6._0_4_ = 0;
  while ((int)(uint)verifier_6 < 3) {
    local_228 = *(StateVerifier **)
                 ((long)&stack0xffffffffffffffc8 + (long)(int)(uint)verifier_6 * 8);
    this_09 = (DepthClearCase *)operator_new(0xa0);
    pSVar7 = local_228;
    verifier_7._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_7,"depth_clear_value",
               (allocator<char> *)((long)&verifier_7 + 7));
    pcVar6 = FloatStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_228);
    std::operator+(&local_248,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_7,pcVar6);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::DepthClearCase::DepthClearCase(this_09,pCVar1,pSVar7,pcVar6,"DEPTH_CLEAR_VALUE")
    ;
    verifier_7._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_09);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&_verifierNdx_7);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_7 + 7));
    verifier_6._0_4_ = (uint)verifier_6 + 1;
    pSVar7 = (StateVerifier *)(ulong)(uint)verifier_6;
  }
  verifier_7._0_4_ = 0;
  while ((int)(uint)verifier_7 < 3) {
    local_278 = *(StateVerifier **)
                 ((long)&stack0xffffffffffffffc8 + (long)(int)(uint)verifier_7 * 8);
    this_10 = (AliasedPointSizeRangeCase *)operator_new(0xa0);
    pSVar7 = local_278;
    verifier_8._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_8,"aliased_point_size_range",
               (allocator<char> *)((long)&verifier_8 + 7));
    pcVar6 = FloatStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_278);
    std::operator+(&local_298,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_8,pcVar6);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::AliasedPointSizeRangeCase::AliasedPointSizeRangeCase
              (this_10,pCVar1,pSVar7,pcVar6,"ALIASED_POINT_SIZE_RANGE");
    verifier_8._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_10);
    std::__cxx11::string::~string((string *)&local_298);
    std::__cxx11::string::~string((string *)&_verifierNdx_8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_8 + 7));
    verifier_7._0_4_ = (uint)verifier_7 + 1;
    pSVar7 = (StateVerifier *)(ulong)(uint)verifier_7;
  }
  verifier_8._0_4_ = 0;
  while ((int)(uint)verifier_8 < 3) {
    local_2c8 = *(StateVerifier **)
                 ((long)&stack0xffffffffffffffc8 + (long)(int)(uint)verifier_8 * 8);
    this_11 = (AliasedLineWidthRangeCase *)operator_new(0xa0);
    pSVar7 = local_2c8;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_308,"aliased_line_width_range",&local_309);
    pcVar6 = FloatStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_2c8);
    std::operator+(&local_2e8,&local_308,pcVar6);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::AliasedLineWidthRangeCase::AliasedLineWidthRangeCase
              (this_11,pCVar1,pSVar7,pcVar6,"ALIASED_LINE_WIDTH_RANGE");
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_11);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::__cxx11::string::~string((string *)&local_308);
    std::allocator<char>::~allocator(&local_309);
    verifier_8._0_4_ = (uint)verifier_8 + 1;
    pSVar7 = (StateVerifier *)(ulong)(uint)verifier_8;
  }
  return (int)pSVar7;
}

Assistant:

void FloatStateQueryTests::init (void)
{
	DE_ASSERT(m_verifierBoolean == DE_NULL);
	DE_ASSERT(m_verifierInteger == DE_NULL);
	DE_ASSERT(m_verifierFloat == DE_NULL);

	m_verifierBoolean		= new GetBooleanVerifier	(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());
	m_verifierInteger		= new GetIntegerVerifier	(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());
	m_verifierFloat			= new GetFloatVerifier		(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());

	StateVerifier* verifiers[] = {m_verifierBoolean, m_verifierInteger, m_verifierFloat};

	FOR_EACH_VERIFIER(verifiers, addChild(new DepthRangeCase				(m_context, verifier,	(std::string("depth_range")					+ verifier->getTestNamePostfix()).c_str(),	"DEPTH_RANGE")));
	FOR_EACH_VERIFIER(verifiers, addChild(new LineWidthCase					(m_context, verifier,	(std::string("line_width")					+ verifier->getTestNamePostfix()).c_str(),	"LINE_WIDTH")));
	FOR_EACH_VERIFIER(verifiers, addChild(new PolygonOffsetFactorCase		(m_context, verifier,	(std::string("polygon_offset_factor")		+ verifier->getTestNamePostfix()).c_str(),	"POLYGON_OFFSET_FACTOR")));
	FOR_EACH_VERIFIER(verifiers, addChild(new PolygonOffsetUnitsCase		(m_context, verifier,	(std::string("polygon_offset_units")		+ verifier->getTestNamePostfix()).c_str(),	"POLYGON_OFFSET_UNITS")));
	FOR_EACH_VERIFIER(verifiers, addChild(new SampleCoverageCase			(m_context, verifier,	(std::string("sample_coverage_value")		+ verifier->getTestNamePostfix()).c_str(),	"SAMPLE_COVERAGE_VALUE")));
	FOR_EACH_VERIFIER(verifiers, addChild(new ColorClearCase				(m_context, verifier,	(std::string("color_clear_value")			+ verifier->getTestNamePostfix()).c_str(),	"COLOR_CLEAR_VALUE")));
	FOR_EACH_VERIFIER(verifiers, addChild(new DepthClearCase				(m_context, verifier,	(std::string("depth_clear_value")			+ verifier->getTestNamePostfix()).c_str(),	"DEPTH_CLEAR_VALUE")));
	FOR_EACH_VERIFIER(verifiers, addChild(new AliasedPointSizeRangeCase		(m_context, verifier,	(std::string("aliased_point_size_range")	+ verifier->getTestNamePostfix()).c_str(),	"ALIASED_POINT_SIZE_RANGE")));
	FOR_EACH_VERIFIER(verifiers, addChild(new AliasedLineWidthRangeCase		(m_context, verifier,	(std::string("aliased_line_width_range")	+ verifier->getTestNamePostfix()).c_str(),	"ALIASED_LINE_WIDTH_RANGE")));
}